

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handoff.cc
# Opt level: O0

int SSL_set_handshake_hints(SSL *ssl,uint8_t *hints,size_t hints_len)

{
  bool bVar1;
  int iVar2;
  pointer pSVar3;
  pointer pSVar4;
  Span<const_unsigned_char> SVar5;
  undefined1 local_258 [8];
  CBS private_key;
  CBS public_key;
  uint64_t group_id_1;
  undefined1 local_200 [8];
  CBS output;
  CBS input_1;
  uint64_t alg;
  undefined1 local_198 [8];
  CBS signature;
  CBS spki;
  CBS input;
  uint64_t sig_alg;
  undefined1 local_140 [8];
  CBS secret;
  CBS ciphertext;
  uint64_t group_id;
  int local_f8;
  int local_f4;
  int has_ticket;
  int has_ecdhe;
  int has_server_random_tls12;
  int has_cert_compression;
  int has_psk;
  int has_signature_hint;
  int has_key_share;
  int has_server_random_tls13;
  CBS ticket;
  CBS ecdhe;
  CBS server_random_tls12;
  CBS cert_compression;
  CBS psk;
  CBS signature_hint;
  CBS key_share;
  CBS server_random_tls13;
  CBS seq;
  CBS cbs;
  unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter> local_30;
  UniquePtr<SSL_HANDSHAKE_HINTS> hints_obj;
  size_t hints_len_local;
  uint8_t *hints_local;
  SSL *ssl_local;
  
  hints_obj._M_t.super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>._M_head_impl =
       (__uniq_ptr_data<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter,_true,_true>)hints_len;
  iVar2 = SSL_is_dtls(ssl);
  if (iVar2 != 0) {
    ERR_put_error(0x10,0,0x42,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handoff.cc"
                  ,0x405);
    return 0;
  }
  bssl::MakeUnique<bssl::SSL_HANDSHAKE_HINTS>();
  bVar1 = std::operator==(&local_30,(nullptr_t)0x0);
  if (bVar1) {
    ssl_local._4_4_ = 0;
    goto LAB_0017660e;
  }
  CBS_init((CBS *)&seq.len,hints,
           (size_t)hints_obj._M_t.
                   super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>._M_head_impl);
  iVar2 = CBS_get_asn1((CBS *)&seq.len,(CBS *)&server_random_tls13.len,0x20000010);
  if ((((iVar2 != 0) &&
       (iVar2 = CBS_get_optional_asn1
                          ((CBS *)&server_random_tls13.len,(CBS *)&key_share.len,&has_signature_hint
                           ,0x80000000), iVar2 != 0)) &&
      (iVar2 = CBS_get_optional_asn1
                         ((CBS *)&server_random_tls13.len,(CBS *)&signature_hint.len,&has_psk,
                          0xa0000001), iVar2 != 0)) &&
     ((iVar2 = CBS_get_optional_asn1
                         ((CBS *)&server_random_tls13.len,(CBS *)&psk.len,&has_cert_compression,
                          0xa0000002), iVar2 != 0 &&
      (iVar2 = CBS_get_optional_asn1
                         ((CBS *)&server_random_tls13.len,(CBS *)&cert_compression.len,
                          &has_server_random_tls12,0x80000003), iVar2 != 0)))) {
    pSVar3 = std::unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>::operator->
                       (&local_30);
    bVar1 = get_optional_implicit_null
                      ((CBS *)&server_random_tls13.len,&pSVar3->ignore_psk,0x80000004);
    if ((((bVar1) &&
         ((iVar2 = CBS_get_optional_asn1
                             ((CBS *)&server_random_tls13.len,(CBS *)&server_random_tls12.len,
                              &has_ecdhe,0x80000005), iVar2 != 0 &&
          (iVar2 = CBS_get_optional_asn1
                             ((CBS *)&server_random_tls13.len,(CBS *)&ecdhe.len,&has_ticket,
                              0x80000006), iVar2 != 0)))) &&
        (iVar2 = CBS_get_optional_asn1
                           ((CBS *)&server_random_tls13.len,(CBS *)&ticket.len,&local_f4,0x20000007)
        , iVar2 != 0)) &&
       (iVar2 = CBS_get_optional_asn1
                          ((CBS *)&server_random_tls13.len,(CBS *)&has_key_share,&local_f8,
                           0x80000008), iVar2 != 0)) {
      pSVar3 = std::unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>::operator->
                         (&local_30);
      bVar1 = get_optional_implicit_null
                        ((CBS *)&server_random_tls13.len,&pSVar3->renew_ticket,0x80000009);
      if (bVar1) {
        pSVar3 = std::unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>::operator->
                           (&local_30);
        bVar1 = get_optional_implicit_null
                          ((CBS *)&server_random_tls13.len,&pSVar3->ignore_ticket,0x8000000a);
        if (bVar1) {
          if (has_signature_hint != 0) {
            pSVar3 = std::unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>::operator->
                               (&local_30);
            SVar5 = cbs_st::operator_cast_to_Span((cbs_st *)&key_share.len);
            bVar1 = bssl::Array<unsigned_char>::CopyFrom(&pSVar3->server_random_tls13,SVar5);
            if (!bVar1) {
              ssl_local._4_4_ = 0;
              goto LAB_0017660e;
            }
          }
          if (has_psk != 0) {
            iVar2 = CBS_get_asn1_uint64((CBS *)&signature_hint.len,&ciphertext.len);
            if (((iVar2 != 0) && (ciphertext.len != 0)) && (ciphertext.len < 0x10000)) {
              iVar2 = CBS_get_asn1((CBS *)&signature_hint.len,(CBS *)&secret.len,4);
              if (iVar2 != 0) {
                pSVar3 = std::unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>::
                         operator->(&local_30);
                SVar5 = cbs_st::operator_cast_to_Span((cbs_st *)&secret.len);
                bVar1 = bssl::Array<unsigned_char>::CopyFrom(&pSVar3->key_share_ciphertext,SVar5);
                if ((bVar1) &&
                   (iVar2 = CBS_get_asn1((CBS *)&signature_hint.len,(CBS *)local_140,4), iVar2 != 0)
                   ) {
                  pSVar3 = std::unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>::
                           operator->(&local_30);
                  SVar5 = cbs_st::operator_cast_to_Span((cbs_st *)local_140);
                  bVar1 = bssl::Array<unsigned_char>::CopyFrom(&pSVar3->key_share_secret,SVar5);
                  if (bVar1) {
                    pSVar3 = std::unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>::
                             operator->(&local_30);
                    pSVar3->key_share_group_id = (uint16_t)ciphertext.len;
                    goto LAB_00175c84;
                  }
                }
              }
            }
            ERR_put_error(0x10,0,0x13c,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handoff.cc"
                          ,0x439);
            ssl_local._4_4_ = 0;
            goto LAB_0017660e;
          }
LAB_00175c84:
          if (has_cert_compression != 0) {
            iVar2 = CBS_get_asn1_uint64((CBS *)&psk.len,&input.len);
            if (((iVar2 != 0) && (input.len != 0)) && (input.len < 0x10000)) {
              iVar2 = CBS_get_asn1((CBS *)&psk.len,(CBS *)&spki.len,4);
              if (iVar2 != 0) {
                pSVar3 = std::unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>::
                         operator->(&local_30);
                SVar5 = cbs_st::operator_cast_to_Span((cbs_st *)&spki.len);
                bVar1 = bssl::Array<unsigned_char>::CopyFrom(&pSVar3->signature_input,SVar5);
                if ((bVar1) &&
                   (iVar2 = CBS_get_asn1((CBS *)&psk.len,(CBS *)&signature.len,4), iVar2 != 0)) {
                  pSVar3 = std::unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>::
                           operator->(&local_30);
                  SVar5 = cbs_st::operator_cast_to_Span((cbs_st *)&signature.len);
                  bVar1 = bssl::Array<unsigned_char>::CopyFrom(&pSVar3->signature_spki,SVar5);
                  if ((bVar1) &&
                     (iVar2 = CBS_get_asn1((CBS *)&psk.len,(CBS *)local_198,4), iVar2 != 0)) {
                    pSVar3 = std::unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>::
                             operator->(&local_30);
                    SVar5 = cbs_st::operator_cast_to_Span((cbs_st *)local_198);
                    bVar1 = bssl::Array<unsigned_char>::CopyFrom(&pSVar3->signature,SVar5);
                    if (bVar1) {
                      pSVar3 = std::unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>::
                               operator->(&local_30);
                      pSVar3->signature_algorithm = (uint16_t)input.len;
                      goto LAB_00175f20;
                    }
                  }
                }
              }
            }
            ERR_put_error(0x10,0,0x13c,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handoff.cc"
                          ,0x44a);
            ssl_local._4_4_ = 0;
            goto LAB_0017660e;
          }
LAB_00175f20:
          if (has_server_random_tls12 != 0) {
            pSVar3 = std::unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>::operator->
                               (&local_30);
            SVar5 = cbs_st::operator_cast_to_Span((cbs_st *)&cert_compression.len);
            bVar1 = bssl::Array<unsigned_char>::CopyFrom(&pSVar3->decrypted_psk,SVar5);
            if (!bVar1) {
              ssl_local._4_4_ = 0;
              goto LAB_0017660e;
            }
          }
          if ((has_server_random_tls12 != 0) &&
             (pSVar3 = std::unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>::
                       operator->(&local_30), (pSVar3->ignore_psk & 1U) != 0)) {
            ERR_put_error(0x10,0,0x13c,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handoff.cc"
                          ,0x454);
            ssl_local._4_4_ = 0;
            goto LAB_0017660e;
          }
          if (has_ecdhe != 0) {
            iVar2 = CBS_get_asn1_uint64((CBS *)&server_random_tls12.len,&input_1.len);
            if (((iVar2 != 0) && (input_1.len != 0)) && (input_1.len < 0x10000)) {
              iVar2 = CBS_get_asn1((CBS *)&server_random_tls12.len,(CBS *)&output.len,4);
              if (iVar2 != 0) {
                pSVar3 = std::unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>::
                         operator->(&local_30);
                SVar5 = cbs_st::operator_cast_to_Span((cbs_st *)&output.len);
                bVar1 = bssl::Array<unsigned_char>::CopyFrom(&pSVar3->cert_compression_input,SVar5);
                if ((bVar1) &&
                   (iVar2 = CBS_get_asn1((CBS *)&server_random_tls12.len,(CBS *)local_200,4),
                   iVar2 != 0)) {
                  pSVar3 = std::unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>::
                           operator->(&local_30);
                  SVar5 = cbs_st::operator_cast_to_Span((cbs_st *)local_200);
                  bVar1 = bssl::Array<unsigned_char>::CopyFrom
                                    (&pSVar3->cert_compression_output,SVar5);
                  if (bVar1) {
                    pSVar3 = std::unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>::
                             operator->(&local_30);
                    pSVar3->cert_compression_alg_id = (uint16_t)input_1.len;
                    goto LAB_0017620b;
                  }
                }
              }
            }
            ERR_put_error(0x10,0,0x13c,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handoff.cc"
                          ,0x461);
            ssl_local._4_4_ = 0;
            goto LAB_0017660e;
          }
LAB_0017620b:
          if (has_ticket != 0) {
            pSVar3 = std::unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>::operator->
                               (&local_30);
            SVar5 = cbs_st::operator_cast_to_Span((cbs_st *)&ecdhe.len);
            bVar1 = bssl::Array<unsigned_char>::CopyFrom(&pSVar3->server_random_tls12,SVar5);
            if (!bVar1) {
              ssl_local._4_4_ = 0;
              goto LAB_0017660e;
            }
          }
          if (local_f4 == 0) {
LAB_001764a4:
            if (local_f8 != 0) {
              pSVar3 = std::unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>::
                       operator->(&local_30);
              SVar5 = cbs_st::operator_cast_to_Span((cbs_st *)&has_key_share);
              bVar1 = bssl::Array<unsigned_char>::CopyFrom(&pSVar3->decrypted_ticket,SVar5);
              if (!bVar1) {
                ssl_local._4_4_ = 0;
                goto LAB_0017660e;
              }
            }
            if ((local_f8 == 0) ||
               (pSVar3 = std::unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>::
                         operator->(&local_30), (pSVar3->ignore_ticket & 1U) == 0)) {
              if ((local_f8 == 0) &&
                 (pSVar3 = std::unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>::
                           operator->(&local_30), (pSVar3->renew_ticket & 1U) != 0)) {
                ERR_put_error(0x10,0,0x13c,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handoff.cc"
                              ,0x483);
                ssl_local._4_4_ = 0;
              }
              else {
                pSVar4 = std::unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>::operator->
                                   (&ssl->s3->hs);
                std::unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>::operator=
                          (&pSVar4->hints,&local_30);
                ssl_local._4_4_ = 1;
              }
            }
            else {
              ERR_put_error(0x10,0,0x13c,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handoff.cc"
                            ,0x47f);
              ssl_local._4_4_ = 0;
            }
          }
          else {
            iVar2 = CBS_get_asn1_uint64((CBS *)&ticket.len,&public_key.len);
            if (((iVar2 != 0) && (public_key.len != 0)) && (public_key.len < 0x10000)) {
              iVar2 = CBS_get_asn1((CBS *)&ticket.len,(CBS *)&private_key.len,4);
              if (iVar2 != 0) {
                pSVar3 = std::unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>::
                         operator->(&local_30);
                SVar5 = cbs_st::operator_cast_to_Span((cbs_st *)&private_key.len);
                bVar1 = bssl::Array<unsigned_char>::CopyFrom(&pSVar3->ecdhe_public_key,SVar5);
                if ((bVar1) &&
                   (iVar2 = CBS_get_asn1((CBS *)&ticket.len,(CBS *)local_258,4), iVar2 != 0)) {
                  pSVar3 = std::unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>::
                           operator->(&local_30);
                  SVar5 = cbs_st::operator_cast_to_Span((cbs_st *)local_258);
                  bVar1 = bssl::Array<unsigned_char>::CopyFrom(&pSVar3->ecdhe_private_key,SVar5);
                  if (bVar1) {
                    pSVar3 = std::unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>::
                             operator->(&local_30);
                    pSVar3->ecdhe_group_id = (uint16_t)public_key.len;
                    goto LAB_001764a4;
                  }
                }
              }
            }
            ERR_put_error(0x10,0,0x13c,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handoff.cc"
                          ,0x475);
            ssl_local._4_4_ = 0;
          }
          goto LAB_0017660e;
        }
      }
    }
  }
  ERR_put_error(0x10,0,0x13c,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handoff.cc"
                ,0x427);
  ssl_local._4_4_ = 0;
LAB_0017660e:
  std::unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>::~unique_ptr(&local_30);
  return ssl_local._4_4_;
}

Assistant:

int SSL_set_handshake_hints(SSL *ssl, const uint8_t *hints, size_t hints_len) {
  if (SSL_is_dtls(ssl)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return 0;
  }

  UniquePtr<SSL_HANDSHAKE_HINTS> hints_obj = MakeUnique<SSL_HANDSHAKE_HINTS>();
  if (hints_obj == nullptr) {
    return 0;
  }

  CBS cbs, seq, server_random_tls13, key_share, signature_hint, psk,
      cert_compression, server_random_tls12, ecdhe, ticket;
  int has_server_random_tls13, has_key_share, has_signature_hint, has_psk,
      has_cert_compression, has_server_random_tls12, has_ecdhe, has_ticket;
  CBS_init(&cbs, hints, hints_len);
  if (!CBS_get_asn1(&cbs, &seq, CBS_ASN1_SEQUENCE) ||
      !CBS_get_optional_asn1(&seq, &server_random_tls13,
                             &has_server_random_tls13, kServerRandomTLS13Tag) ||
      !CBS_get_optional_asn1(&seq, &key_share, &has_key_share,
                             kKeyShareHintTag) ||
      !CBS_get_optional_asn1(&seq, &signature_hint, &has_signature_hint,
                             kSignatureHintTag) ||
      !CBS_get_optional_asn1(&seq, &psk, &has_psk, kDecryptedPSKTag) ||
      !get_optional_implicit_null(&seq, &hints_obj->ignore_psk,
                                  kIgnorePSKTag) ||
      !CBS_get_optional_asn1(&seq, &cert_compression, &has_cert_compression,
                             kCompressCertificateTag) ||
      !CBS_get_optional_asn1(&seq, &server_random_tls12,
                             &has_server_random_tls12, kServerRandomTLS12Tag) ||
      !CBS_get_optional_asn1(&seq, &ecdhe, &has_ecdhe, kECDHEHintTag) ||
      !CBS_get_optional_asn1(&seq, &ticket, &has_ticket, kDecryptedTicketTag) ||
      !get_optional_implicit_null(&seq, &hints_obj->renew_ticket,
                                  kRenewTicketTag) ||
      !get_optional_implicit_null(&seq, &hints_obj->ignore_ticket,
                                  kIgnoreTicketTag)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_COULD_NOT_PARSE_HINTS);
    return 0;
  }

  if (has_server_random_tls13 &&
      !hints_obj->server_random_tls13.CopyFrom(server_random_tls13)) {
    return 0;
  }

  if (has_key_share) {
    uint64_t group_id;
    CBS ciphertext, secret;
    if (!CBS_get_asn1_uint64(&key_share, &group_id) ||  //
        group_id == 0 || group_id > 0xffff ||
        !CBS_get_asn1(&key_share, &ciphertext, CBS_ASN1_OCTETSTRING) ||
        !hints_obj->key_share_ciphertext.CopyFrom(ciphertext) ||
        !CBS_get_asn1(&key_share, &secret, CBS_ASN1_OCTETSTRING) ||
        !hints_obj->key_share_secret.CopyFrom(secret)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_COULD_NOT_PARSE_HINTS);
      return 0;
    }
    hints_obj->key_share_group_id = static_cast<uint16_t>(group_id);
  }

  if (has_signature_hint) {
    uint64_t sig_alg;
    CBS input, spki, signature;
    if (!CBS_get_asn1_uint64(&signature_hint, &sig_alg) ||  //
        sig_alg == 0 || sig_alg > 0xffff ||
        !CBS_get_asn1(&signature_hint, &input, CBS_ASN1_OCTETSTRING) ||
        !hints_obj->signature_input.CopyFrom(input) ||
        !CBS_get_asn1(&signature_hint, &spki, CBS_ASN1_OCTETSTRING) ||
        !hints_obj->signature_spki.CopyFrom(spki) ||
        !CBS_get_asn1(&signature_hint, &signature, CBS_ASN1_OCTETSTRING) ||
        !hints_obj->signature.CopyFrom(signature)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_COULD_NOT_PARSE_HINTS);
      return 0;
    }
    hints_obj->signature_algorithm = static_cast<uint16_t>(sig_alg);
  }

  if (has_psk && !hints_obj->decrypted_psk.CopyFrom(psk)) {
    return 0;
  }
  if (has_psk && hints_obj->ignore_psk) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_COULD_NOT_PARSE_HINTS);
    return 0;
  }

  if (has_cert_compression) {
    uint64_t alg;
    CBS input, output;
    if (!CBS_get_asn1_uint64(&cert_compression, &alg) ||  //
        alg == 0 || alg > 0xffff ||
        !CBS_get_asn1(&cert_compression, &input, CBS_ASN1_OCTETSTRING) ||
        !hints_obj->cert_compression_input.CopyFrom(input) ||
        !CBS_get_asn1(&cert_compression, &output, CBS_ASN1_OCTETSTRING) ||
        !hints_obj->cert_compression_output.CopyFrom(output)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_COULD_NOT_PARSE_HINTS);
      return 0;
    }
    hints_obj->cert_compression_alg_id = static_cast<uint16_t>(alg);
  }

  if (has_server_random_tls12 &&
      !hints_obj->server_random_tls12.CopyFrom(server_random_tls12)) {
    return 0;
  }

  if (has_ecdhe) {
    uint64_t group_id;
    CBS public_key, private_key;
    if (!CBS_get_asn1_uint64(&ecdhe, &group_id) ||  //
        group_id == 0 || group_id > 0xffff ||
        !CBS_get_asn1(&ecdhe, &public_key, CBS_ASN1_OCTETSTRING) ||
        !hints_obj->ecdhe_public_key.CopyFrom(public_key) ||
        !CBS_get_asn1(&ecdhe, &private_key, CBS_ASN1_OCTETSTRING) ||
        !hints_obj->ecdhe_private_key.CopyFrom(private_key)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_COULD_NOT_PARSE_HINTS);
      return 0;
    }
    hints_obj->ecdhe_group_id = static_cast<uint16_t>(group_id);
  }

  if (has_ticket && !hints_obj->decrypted_ticket.CopyFrom(ticket)) {
    return 0;
  }
  if (has_ticket && hints_obj->ignore_ticket) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_COULD_NOT_PARSE_HINTS);
    return 0;
  }
  if (!has_ticket && hints_obj->renew_ticket) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_COULD_NOT_PARSE_HINTS);
    return 0;
  }

  ssl->s3->hs->hints = std::move(hints_obj);
  return 1;
}